

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoTuples.h
# Opt level: O3

void __thiscall
chrono::
ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
::ChConstraintTwoTuples
          (ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           *this,ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
                 *other)

{
  double dVar1;
  
  (this->super_ChConstraint).valid = false;
  (this->super_ChConstraint).disabled = false;
  (this->super_ChConstraint).redundant = false;
  (this->super_ChConstraint).broken = false;
  (this->super_ChConstraint).c_i = 0.0;
  (this->super_ChConstraint).l_i = 0.0;
  (this->super_ChConstraint).b_i = 0.0;
  (this->super_ChConstraint).cfm_i = 0.0;
  (this->super_ChConstraint).active = true;
  (this->super_ChConstraint).mode = CONSTRAINT_LOCK;
  (this->super_ChConstraint).g_i = 0.0;
  (this->super_ChConstraint)._vptr_ChConstraint = (_func_int **)&PTR__ChConstraintTwoTuples_00b138a0
  ;
  (this->tuple_a).variables = (other->tuple_a).variables;
  dVar1 = (other->tuple_a).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage
          .m_data.array[1];
  (this->tuple_a).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.
  array[0] = (other->tuple_a).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
             m_storage.m_data.array[0];
  (this->tuple_a).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.
  array[1] = dVar1;
  dVar1 = (other->tuple_a).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage
          .m_data.array[3];
  (this->tuple_a).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.
  array[2] = (other->tuple_a).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
             m_storage.m_data.array[2];
  (this->tuple_a).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.
  array[3] = dVar1;
  dVar1 = (other->tuple_a).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage
          .m_data.array[5];
  (this->tuple_a).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.
  array[4] = (other->tuple_a).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
             m_storage.m_data.array[4];
  (this->tuple_a).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.
  array[5] = dVar1;
  dVar1 = (other->tuple_a).Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
          .m_data.array[1];
  (this->tuple_a).Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
  array[0] = (other->tuple_a).Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
             m_storage.m_data.array[0];
  (this->tuple_a).Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
  array[1] = dVar1;
  dVar1 = (other->tuple_a).Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
          .m_data.array[3];
  (this->tuple_a).Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
  array[2] = (other->tuple_a).Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
             m_storage.m_data.array[2];
  (this->tuple_a).Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
  array[3] = dVar1;
  dVar1 = (other->tuple_a).Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
          .m_data.array[5];
  (this->tuple_a).Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
  array[4] = (other->tuple_a).Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
             m_storage.m_data.array[4];
  (this->tuple_a).Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
  array[5] = dVar1;
  (this->tuple_b).variables = (other->tuple_b).variables;
  dVar1 = (other->tuple_b).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage
          .m_data.array[1];
  (this->tuple_b).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.
  array[0] = (other->tuple_b).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
             m_storage.m_data.array[0];
  (this->tuple_b).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.
  array[1] = dVar1;
  dVar1 = (other->tuple_b).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage
          .m_data.array[3];
  (this->tuple_b).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.
  array[2] = (other->tuple_b).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
             m_storage.m_data.array[2];
  (this->tuple_b).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.
  array[3] = dVar1;
  dVar1 = (other->tuple_b).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage
          .m_data.array[5];
  (this->tuple_b).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.
  array[4] = (other->tuple_b).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
             m_storage.m_data.array[4];
  (this->tuple_b).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.
  array[5] = dVar1;
  dVar1 = (other->tuple_b).Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
          .m_data.array[1];
  (this->tuple_b).Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
  array[0] = (other->tuple_b).Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
             m_storage.m_data.array[0];
  (this->tuple_b).Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
  array[1] = dVar1;
  dVar1 = (other->tuple_b).Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
          .m_data.array[3];
  (this->tuple_b).Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
  array[2] = (other->tuple_b).Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
             m_storage.m_data.array[2];
  (this->tuple_b).Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
  array[3] = dVar1;
  dVar1 = (other->tuple_b).Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
          .m_data.array[5];
  (this->tuple_b).Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
  array[4] = (other->tuple_b).Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
             m_storage.m_data.array[4];
  (this->tuple_b).Eq.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
  array[5] = dVar1;
  return;
}

Assistant:

ChConstraintTwoTuples(const ChConstraintTwoTuples& other) : tuple_a(other.tuple_a), tuple_b(other.tuple_b) {}